

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O1

void __thiscall Group::update_labels(Group *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char buf [32];
  string local_88;
  string local_68;
  char local_48 [32];
  
  iVar1 = HSlider::get_cur_value(&this->freq_slider);
  iVar2 = HSlider::get_cur_value(&this->phase_slider);
  sprintf(local_48,"%4.0f Hz",(double)iVar1);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  sVar3 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_48,local_48 + sVar3);
  Label::set_text(&this->freq_val_label,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_48,anon_var_dwarf_191,
          (double)((float)iVar2 / 100.0 + -3.1415927) / 3.141592653589793);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  sVar3 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,local_48,local_48 + sVar3);
  Label::set_text(&this->phase_val_label,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Group::update_labels()
{
   char buf[32];
   float frequency = get_frequency();
   float phase = get_phase();

   sprintf(buf, "%4.0f Hz", frequency);
   freq_val_label.set_text(buf);

   sprintf(buf, "%.2f π", phase/PI);
   phase_val_label.set_text(buf);
}